

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaDeviceIndex Pa_GetDefaultInputDevice(void)

{
  uint uVar1;
  PaDeviceIndex PVar2;
  
  uVar1 = Pa_GetDefaultHostApi();
  if ((int)uVar1 < 0) {
    PVar2 = -1;
  }
  else {
    PVar2 = (hostApis_[uVar1]->info).defaultInputDevice;
  }
  return PVar2;
}

Assistant:

PaDeviceIndex Pa_GetDefaultInputDevice( void )
{
    PaHostApiIndex hostApi;
    PaDeviceIndex result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultInputDevice" );

    hostApi = Pa_GetDefaultHostApi();
    if( hostApi < 0 )
    {
        result = paNoDevice;
    }
    else
    {
        result = hostApis_[hostApi]->info.defaultInputDevice;
    }

    PA_LOGAPI_EXIT_T( "Pa_GetDefaultInputDevice", "PaDeviceIndex: %d", result );

    return result;
}